

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O3

void ** adt_hash_iter_next(adt_hash_t *self,char **ppKey)

{
  adt_hnode_t *paVar1;
  adt_hmatch_t *paVar2;
  undefined8 *__ptr;
  long *pVal;
  adt_hkey_t *paVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  
  if (ppKey == (char **)0x0 || self == (adt_hash_t *)0x0) {
    return (void **)0x0;
  }
  paVar3 = (self->iter).pHkey;
  if (paVar3 == (adt_hkey_t *)0x0) {
LAB_001201ee:
    paVar1 = (self->iter).pNode;
    bVar6 = (self->iter).u8Cur;
    if (paVar1->u8Width == '\x10') goto code_r0x00120200;
    if (paVar1->u8Cur <= bVar6) goto LAB_00120237;
    paVar2 = (paVar1->child).match;
    (self->iter).u8Cur = bVar6 + 1;
    paVar3 = paVar2[bVar6].key;
    (self->iter).pHkey = paVar3;
    goto LAB_001202ad;
  }
  goto LAB_001202b6;
code_r0x00120200:
  if (bVar6 < 0x10) {
    lVar4 = (ulong)bVar6 << 4;
    bVar5 = bVar6;
    do {
      paVar2 = (paVar1->child).match;
      bVar6 = bVar5 + 1;
      (self->iter).u8Cur = bVar6;
      if (*(char *)((long)&paVar2->u32Hash + lVar4 + 1) != '\0') {
        pVal = (long *)malloc(0x10);
        if (pVal != (long *)0x0) {
          *pVal = (long)paVar1;
          *(byte *)(pVal + 1) = bVar6;
        }
        adt_stack_push(&self->iter_stack,pVal);
        (self->iter).pNode = (adt_hnode_t *)((long)&paVar2->u32Hash + lVar4);
        (self->iter).u8Cur = '\0';
        goto LAB_001201ee;
      }
      lVar4 = lVar4 + 0x10;
      bVar7 = bVar5 < 0xf;
      bVar5 = bVar6;
    } while (bVar7);
  }
  if (bVar6 == 0x10) {
LAB_00120237:
    __ptr = (undefined8 *)adt_stack_pop(&self->iter_stack);
    if (__ptr == (undefined8 *)0x0) goto LAB_0012028f;
    (self->iter).pNode = (adt_hnode_t *)*__ptr;
    (self->iter).u8Cur = *(uint8_t *)(__ptr + 1);
    free(__ptr);
    goto LAB_001201ee;
  }
LAB_0012028f:
  paVar3 = (self->iter).pHkey;
LAB_001202ad:
  if (paVar3 == (adt_hkey_t *)0x0) {
    *ppKey = (char *)0x0;
    return (void **)0x0;
  }
LAB_001202b6:
  *ppKey = paVar3->key;
  paVar3 = (self->iter).pHkey;
  (self->iter).pHkey = paVar3->next;
  return &paVar3->val;
}

Assistant:

void** adt_hash_iter_next(adt_hash_t *self,const char **ppKey){
	if(!self || !ppKey ) return (void*) 0;

	if(self->iter.pHkey == 0){
		//find next hkey
		adt_hnode_t *pNode;
BEGIN:
		pNode =  self->iter.pNode;
		if(pNode->u8Width == 16){
			while(self->iter.u8Cur<16){
				adt_hnode_t *pChild = &pNode->child.node[self->iter.u8Cur++];
				if(pChild->u8Cur>0){
					adt_stack_push(&self->iter_stack,adt_hit_stored_new(pNode,self->iter.u8Cur));
					self->iter.pNode = pChild;
					self->iter.u8Cur = 0;
					goto BEGIN;
				}
			}
			if(self->iter.u8Cur==16){
				//check stack
				adt_hit_stored_t *pStored = (adt_hit_stored_t*) adt_stack_pop(&self->iter_stack);
				if(pStored){
					//restore self->iter.Pnode and continue
					self->iter.pNode = pStored->pNode;
					self->iter.u8Cur = pStored->u8Cur;
					adt_hit_stored_delete(pStored);
					goto BEGIN;
				}
			}
		}
		else{
			if(self->iter.u8Cur >= pNode->u8Cur){
				adt_hit_stored_t *pStored = (adt_hit_stored_t*) adt_stack_pop(&self->iter_stack);
				if(pStored){
					//restore self->iter.Pnode and continue
					self->iter.pNode = pStored->pNode;
					self->iter.u8Cur = pStored->u8Cur;
					adt_hit_stored_delete(pStored);
					goto BEGIN;
				}
			}
			else{
				self->iter.pHkey = pNode->child.match[self->iter.u8Cur++].key;
			}
		}
	}

	if(self->iter.pHkey){
      void **ppVal;
      *ppKey = self->iter.pHkey->key;
		ppVal = &self->iter.pHkey->val;
		self->iter.pHkey = self->iter.pHkey->next;
		return ppVal;
	}
	else{
		*ppKey=0;
		return (void**) 0; //done
	}
}